

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_cost_test.cc
# Opt level: O0

void anon_unknown.dwarf_135084a::TestMvComponentCostTable(MvSubpelPrecision precision)

{
  bool bVar1;
  MvSubpelPrecision in_stack_00000017;
  nmv_component *in_stack_00000018;
  int *in_stack_00000020;
  AssertionResult gtest_ar_1;
  int *in_stack_00000080;
  AssertionResult gtest_ar;
  int v;
  int *mvcost;
  int *mvcost_ref;
  unique_ptr<int[],_std::default_delete<int[]>_> mvcost_buf;
  unique_ptr<int[],_std::default_delete<int[]>_> mvcost_ref_buf;
  char (*in_stack_ffffffffffffff18) [5];
  unique_ptr<int[],_std::default_delete<int[]>_> *in_stack_ffffffffffffff20;
  Message *in_stack_ffffffffffffff28;
  Message *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_78;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar2;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_50;
  int local_3c;
  pointer local_38;
  pointer local_30;
  
  operator_new__(0x1fffc);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            (in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
  operator_new__(0x1fffc);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            (in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
  local_30 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get(in_stack_ffffffffffffff20);
  local_30 = local_30 + 0x3fff;
  local_38 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get(in_stack_ffffffffffffff20);
  local_38 = local_38 + 0x3fff;
  ReferenceBuildNmvComponentCostTable(in_stack_00000020,in_stack_00000018,in_stack_00000017);
  av1_build_nmv_component_cost_table
            (in_stack_00000080,
             (nmv_component *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,gtest_ar_1._7_1_);
  for (local_3c = 0; local_3c < 0x4000; local_3c = local_3c + 1) {
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (char *)in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,
               (int *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff50 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff48 =
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff40 =
           testing::AssertionResult::failure_message((AssertionResult *)0xbce92d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff50,(Type)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 (char *)in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffa0,
                 (Message *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0xbce987);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbce9f5);
    if (uVar2 != 0) break;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (char *)in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,
               (int *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    in_stack_ffffffffffffff3c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff30 =
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff28 =
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff20 =
           (unique_ptr<int[],_std::default_delete<int[]>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0xbcead5);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff50,(Type)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 (char *)in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffa0,(Message *)CONCAT44(uVar2,in_stack_ffffffffffffff98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0xbceb23);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbceb85);
    if (uVar2 != 0) break;
    in_stack_ffffffffffffff9c = 0;
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(in_stack_ffffffffffffff20);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void TestMvComponentCostTable(MvSubpelPrecision precision) {
  std::unique_ptr<int[]> mvcost_ref_buf(new int[MV_VALS]);
  std::unique_ptr<int[]> mvcost_buf(new int[MV_VALS]);
  int *mvcost_ref = mvcost_ref_buf.get() + MV_MAX;
  int *mvcost = mvcost_buf.get() + MV_MAX;

  ReferenceBuildNmvComponentCostTable(mvcost_ref, &kTestComponentContext,
                                      precision);
  av1_build_nmv_component_cost_table(mvcost, &kTestComponentContext, precision);

  for (int v = 0; v <= MV_MAX; ++v) {
    ASSERT_EQ(mvcost_ref[v], mvcost[v]) << "v = " << v;
    ASSERT_EQ(mvcost_ref[-v], mvcost[-v]) << "v = " << v;
  }
}